

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  long *plVar1;
  Extension *pEVar2;
  bool bVar3;
  int number;
  Type TVar4;
  MessageLite *pMVar5;
  Label *v1;
  Label *v2;
  char *pcVar6;
  LogMessage *pLVar7;
  CppType *pCVar8;
  CppType *pCVar9;
  Descriptor *pDVar10;
  undefined8 uVar11;
  LogMessage local_c0;
  Voidify local_a9;
  CppType local_a8;
  CppType local_a4;
  Nullable<const_char_*> local_a0;
  LogMessage local_98;
  Voidify local_81;
  Label local_80;
  Label local_7c;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  MessageLite *prototype;
  LogMessage local_58;
  Voidify local_41;
  CppType local_40;
  CppType local_3c;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  MessageFactory *factory_local;
  FieldDescriptor *descriptor_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)factory;
  factory_local = (MessageFactory *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  number = FieldDescriptor::number(descriptor);
  bVar3 = MaybeNewExtension(this,number,(FieldDescriptor *)factory_local,
                            (Extension **)&absl_log_internal_check_op_result);
  if (bVar3) {
    TVar4 = FieldDescriptor::type((FieldDescriptor *)factory_local);
    absl_log_internal_check_op_result[8] = (char)TVar4;
    local_3c = internal::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar8 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                       (&local_3c);
    local_40 = CPPTYPE_MESSAGE;
    pCVar9 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                       (&local_40);
    local_38 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                         (pCVar8,pCVar9,
                          "cpp_type(extension->type) == FieldDescriptor::CPPTYPE_MESSAGE");
    pEVar2 = extension;
    if (local_38 != (Nullable<const_char_*>)0x0) {
      pcVar6 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x8a,pcVar6);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar7);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    absl_log_internal_check_op_result[9] = '\0';
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfeU | 1;
    absl_log_internal_check_op_result[0xb] = '\0';
    pDVar10 = FieldDescriptor::message_type((FieldDescriptor *)factory_local);
    absl_log_internal_check_op_result_1 =
         (Nullable<const_char_*>)
         (**(code **)((pEVar2->field_0).int64_t_value + 0x10))(pEVar2,pDVar10);
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfb;
    pMVar5 = MessageLite::New((MessageLite *)absl_log_internal_check_op_result_1,this->arena_);
    *(MessageLite **)absl_log_internal_check_op_result = pMVar5;
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfd;
    this_local = *(ExtensionSet **)absl_log_internal_check_op_result;
  }
  else {
    local_7c = LABEL_OPTIONAL;
    if ((absl_log_internal_check_op_result[9] & 1U) != 0) {
      local_7c = LABEL_REPEATED;
    }
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Label>(&local_7c);
    local_80 = LABEL_OPTIONAL;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Label>(&local_80);
    local_78 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                         (v1,v2,
                          "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_OPTIONAL"
                         );
    if (local_78 != (Nullable<const_char_*>)0x0) {
      pcVar6 = absl::lts_20250127::implicit_cast<char_const*>(local_78);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x95,pcVar6);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar7);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    }
    local_a4 = internal::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar8 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                       (&local_a4);
    local_a8 = CPPTYPE_MESSAGE;
    pCVar9 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::CppType>
                       (&local_a8);
    local_a0 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                         (pCVar8,pCVar9,
                          "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
    pEVar2 = extension;
    if (local_a0 != (Nullable<const_char_*>)0x0) {
      pcVar6 = absl::lts_20250127::implicit_cast<char_const*>(local_a0);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x95,pcVar6);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar7);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_c0);
    }
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfd;
    if (((byte)absl_log_internal_check_op_result[10] >> 2 & 1) == 0) {
      this_local = *(ExtensionSet **)absl_log_internal_check_op_result;
    }
    else {
      plVar1 = *(long **)absl_log_internal_check_op_result;
      pDVar10 = FieldDescriptor::message_type((FieldDescriptor *)factory_local);
      uVar11 = (**(code **)((pEVar2->field_0).int64_t_value + 0x10))(pEVar2,pDVar10);
      this_local = (ExtensionSet *)(**(code **)(*plVar1 + 0x28))(plVar1,uVar11,this->arena_);
    }
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    ABSL_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->ptr.message_value = prototype->New(arena_);
    extension->is_cleared = false;
    return extension->ptr.message_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()), arena_);
    } else {
      return extension->ptr.message_value;
    }
  }
}